

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsbr.cpp
# Opt level: O0

void __thiscall unodb::qsbr::reset_stats(qsbr *this)

{
  accumulator_set<unsigned_long,_boost::accumulators::stats<boost::accumulators::tag::mean,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_void>
  local_98;
  lock_guard<std::mutex> local_80;
  lock_guard<std::mutex> guard_1;
  accumulator_set<unsigned_long,_boost::accumulators::stats<boost::accumulators::tag::max,_boost::accumulators::tag::variance,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_void>
  local_40;
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> guard;
  qsbr *this_local;
  
  guard._M_device = (mutex_type *)this;
  assert_idle(this);
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->dealloc_stats_lock);
  boost::accumulators::
  accumulator_set<unsigned_long,_boost::accumulators::stats<boost::accumulators::tag::max,_boost::accumulators::tag::variance,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_void>
  ::accumulator_set(&local_40);
  boost::accumulators::
  accumulator_set<unsigned_long,_boost::accumulators::stats<boost::accumulators::tag::max,_boost::accumulators::tag::variance,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_void>
  ::operator=(&this->epoch_dealloc_per_thread_count_stats,&local_40);
  publish_epoch_callback_stats(this);
  boost::accumulators::
  accumulator_set<unsigned_long,_boost::accumulators::stats<boost::accumulators::tag::max,_boost::accumulators::tag::variance,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_void>
  ::accumulator_set((accumulator_set<unsigned_long,_boost::accumulators::stats<boost::accumulators::tag::max,_boost::accumulators::tag::variance,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_void>
                     *)&guard_1);
  boost::accumulators::
  accumulator_set<unsigned_long,_boost::accumulators::stats<boost::accumulators::tag::max,_boost::accumulators::tag::variance,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_void>
  ::operator=(&this->deallocation_size_per_thread_stats,
              (accumulator_set<unsigned_long,_boost::accumulators::stats<boost::accumulators::tag::max,_boost::accumulators::tag::variance,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_void>
               *)&guard_1);
  publish_deallocation_size_stats(this);
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  std::lock_guard<std::mutex>::lock_guard(&local_80,&this->quiescent_state_stats_lock);
  boost::accumulators::
  accumulator_set<unsigned_long,_boost::accumulators::stats<boost::accumulators::tag::mean,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_void>
  ::accumulator_set(&local_98);
  boost::accumulators::
  accumulator_set<unsigned_long,_boost::accumulators::stats<boost::accumulators::tag::mean,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_void>
  ::operator=(&this->quiescent_states_per_thread_between_epoch_change_stats,&local_98);
  publish_quiescent_states_per_thread_between_epoch_change_stats(this);
  std::lock_guard<std::mutex>::~lock_guard(&local_80);
  return;
}

Assistant:

void qsbr::reset_stats() {
  // Stats can only be reset on idle QSBR - best-effort check as nothing
  // prevents to leaving idle state at any time
  assert_idle();

  {
    const std::lock_guard guard{dealloc_stats_lock};

    epoch_dealloc_per_thread_count_stats = {};
    publish_epoch_callback_stats();

    deallocation_size_per_thread_stats = {};
    publish_deallocation_size_stats();
  }

  {
    const std::lock_guard guard{quiescent_state_stats_lock};

    quiescent_states_per_thread_between_epoch_change_stats = {};
    publish_quiescent_states_per_thread_between_epoch_change_stats();
  }
}